

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O0

Measurement * __thiscall
MeasurementFactory::CreateMeasurement
          (MeasurementFactory *this,Sensor *sensor,long timestamp,VectorXd *measurements)

{
  long local_68;
  long local_50;
  Measurement *local_30;
  Measurement *m;
  VectorXd *measurements_local;
  long timestamp_local;
  Sensor *sensor_local;
  MeasurementFactory *this_local;
  
  local_30 = (Measurement *)0x0;
  if (sensor == (Sensor *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = __dynamic_cast(sensor,&Sensor::typeinfo,&LidarSensor::typeinfo,0);
  }
  if (local_50 == 0) {
    if (sensor == (Sensor *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(sensor,&Sensor::typeinfo,&RadarSensor::typeinfo,0);
    }
    if (local_68 != 0) {
      local_30 = (Measurement *)operator_new(0x50);
      RadarMeasurement::RadarMeasurement((RadarMeasurement *)local_30,sensor,timestamp,measurements)
      ;
    }
  }
  else {
    local_30 = (Measurement *)operator_new(0x50);
    LidarMeasurement::LidarMeasurement((LidarMeasurement *)local_30,sensor,timestamp,measurements);
  }
  return local_30;
}

Assistant:

Measurement *MeasurementFactory::CreateMeasurement(const Sensor *sensor, long timestamp, VectorXd &measurements) {

    Measurement *m = 0; 

    if (dynamic_cast<const LidarSensor*>(sensor) != 0) {
        m = new LidarMeasurement(sensor, timestamp, measurements);
    } else if (dynamic_cast<const RadarSensor*>(sensor) != 0) {
        m = new RadarMeasurement(sensor, timestamp, measurements);
    }

    return m;
}